

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O1

void __thiscall
RegVmLoweredFunction::FreeDelayedRegisters(RegVmLoweredFunction *this,RegVmLoweredBlock *lowBlock)

{
  SmallArray<unsigned_char,_16U> *this_00;
  uchar uVar1;
  uint uVar2;
  RegVmLoweredInstruction *pRVar3;
  SmallArray<unsigned_char,_16U> *pSVar4;
  ulong uVar5;
  uchar *puVar6;
  char *__function;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uchar *puVar10;
  bool bVar11;
  
  if ((this->delayedFreedRegisters).count != 0) {
    this_00 = &this->freedRegisters;
    uVar7 = 0;
    do {
      if (lowBlock == (RegVmLoweredBlock *)0x0) {
        puVar10 = (this->delayedFreedRegisters).data;
        uVar2 = (this->killedRegisters).count;
        if (uVar2 == (this->killedRegisters).max) {
          SmallArray<unsigned_char,_16U>::grow(&this->killedRegisters,uVar2);
        }
        puVar6 = (this->killedRegisters).data;
        pSVar4 = &this->killedRegisters;
        if (puVar6 != (uchar *)0x0) goto LAB_0027008b;
LAB_0027016f:
        __function = 
        "void SmallArray<unsigned char, 16>::push_back(const T &) [T = unsigned char, N = 16]";
LAB_002701ba:
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x162,__function);
      }
      pRVar3 = lowBlock->lastInstruction;
      puVar10 = (this->delayedFreedRegisters).data;
      uVar2 = (pRVar3->postKillRegisters).count;
      if (uVar2 == (pRVar3->postKillRegisters).max) {
        SmallArray<unsigned_char,_8U>::grow(&pRVar3->postKillRegisters,uVar2);
      }
      puVar6 = (pRVar3->postKillRegisters).data;
      if (puVar6 == (uchar *)0x0) {
        __function = 
        "void SmallArray<unsigned char, 8>::push_back(const T &) [T = unsigned char, N = 8]";
        goto LAB_002701ba;
      }
      pSVar4 = (SmallArray<unsigned_char,_16U> *)&pRVar3->postKillRegisters;
LAB_0027008b:
      uVar1 = puVar10[uVar7];
      uVar2 = pSVar4->count;
      pSVar4->count = uVar2 + 1;
      puVar6[uVar2] = uVar1;
      if ((this->delayedFreedRegisters).count <= uVar7) {
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x199,
                      "T &SmallArray<unsigned char, 16>::operator[](unsigned int) [T = unsigned char, N = 16]"
                     );
      }
      puVar10 = (this->delayedFreedRegisters).data;
      uVar2 = (this->freedRegisters).count;
      uVar8 = (ulong)uVar2;
      bVar11 = uVar8 != 0;
      if (bVar11) {
        uVar1 = puVar10[uVar7];
        if (*this_00->data == uVar1) goto LAB_00270150;
        uVar5 = 1;
        do {
          uVar9 = uVar5;
          if (uVar8 == uVar9) break;
          uVar5 = uVar9 + 1;
        } while (this_00->data[uVar9] != uVar1);
        bVar11 = uVar9 < uVar8;
      }
      if (bVar11) {
LAB_00270150:
        __assert_fail("!freedRegisters.contains(delayedFreedRegisters[i])",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                      ,0xd8,"void RegVmLoweredFunction::FreeDelayedRegisters(RegVmLoweredBlock *)");
      }
      if (uVar2 == (this->freedRegisters).max) {
        SmallArray<unsigned_char,_16U>::grow(this_00,uVar2);
      }
      if (this_00->data == (uchar *)0x0) goto LAB_0027016f;
      uVar1 = puVar10[uVar7];
      uVar2 = (this->freedRegisters).count;
      (this->freedRegisters).count = uVar2 + 1;
      this_00->data[uVar2] = uVar1;
      uVar7 = uVar7 + 1;
    } while (uVar7 < (this->delayedFreedRegisters).count);
  }
  (this->delayedFreedRegisters).count = 0;
  return;
}

Assistant:

void RegVmLoweredFunction::FreeDelayedRegisters(RegVmLoweredBlock *lowBlock)
{
	for(unsigned i = 0; i < delayedFreedRegisters.size(); i++)
	{
		if(lowBlock)
			lowBlock->lastInstruction->postKillRegisters.push_back(delayedFreedRegisters[i]);
		else
			killedRegisters.push_back(delayedFreedRegisters[i]);

		assert(!freedRegisters.contains(delayedFreedRegisters[i]));
		freedRegisters.push_back(delayedFreedRegisters[i]);
	}

	delayedFreedRegisters.clear();
}